

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

peer_request __thiscall libtorrent::aux::torrent::to_req(torrent *this,piece_block *p)

{
  uint uVar1;
  element_type *this_00;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  peer_request pVar6;
  
  this_00 = (this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = (this_00->m_files).m_piece_length;
  uVar4 = 0x4000;
  if (uVar1 < 0x4000) {
    uVar4 = uVar1;
  }
  if ((int)uVar1 < 1) {
    uVar4 = 0x4000;
  }
  iVar5 = uVar4 * p->block_index;
  iVar2 = file_storage::piece_size(&this_00->m_files,(piece_index_t)(p->piece_index).m_val);
  uVar3 = iVar2 - iVar5;
  uVar1 = (((this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_piece_length;
  uVar4 = 0x4000;
  if (uVar1 < 0x4000) {
    uVar4 = uVar1;
  }
  if ((int)uVar1 < 1) {
    uVar4 = 0x4000;
  }
  if ((int)uVar3 <= (int)uVar4) {
    uVar4 = uVar3;
  }
  pVar6.start = iVar5;
  pVar6.piece.m_val = (p->piece_index).m_val;
  pVar6.length = uVar4;
  return pVar6;
}

Assistant:

peer_request torrent::to_req(piece_block const& p) const
	{
		int const block_offset = p.block_index * block_size();
		int const block = std::min(torrent_file().piece_size(
			p.piece_index) - block_offset, block_size());
		TORRENT_ASSERT(block > 0);
		TORRENT_ASSERT(block <= block_size());

		peer_request r;
		r.piece = p.piece_index;
		r.start = block_offset;
		r.length = block;
		return r;
	}